

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O2

void map2json_freePairsMemory(map2json_keyvalue_t *pair)

{
  if (pair != (map2json_keyvalue_t *)0x0) {
    map2json_freePairsMemory(pair->next);
    free(pair->key);
    free(pair->value);
    free(pair);
    return;
  }
  return;
}

Assistant:

static void map2json_freePairsMemory(map2json_keyvalue_t *pair) {
	DEBUG_PUT("map2json_freePairsMemory([map2json_t *])... ");
	if ( pair == NULL ) {
		DEBUG_PUT("map2json_freePairsMemory([map2json_t *])... DONE");
		return;
	}
	map2json_freePairsMemory(pair->next);
	free(pair->key);
	free(pair->value);
	free(pair);
	DEBUG_PUT("map2json_freePairsMemory([map2json_t *])... DONE");
}